

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_json_schema.cpp
# Opt level: O2

string * __thiscall
flatbuffers::jsons::(anonymous_namespace)::GenType_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,BaseType type)

{
  char *__s;
  string *this_00;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  switch((int)this) {
  case 2:
    __s = "\"type\" : \"boolean\"";
    goto LAB_0020f6c2;
  case 3:
    NumToString<int>(&local_30,-0x80);
    std::operator+(&local_50,"\"type\" : \"integer\", \"minimum\" : ",&local_30);
    std::operator+(&local_90,&local_50,", \"maximum\" : ");
    NumToString<int>(&local_70,0x7f);
    std::operator+(__return_storage_ptr__,&local_90,&local_70);
    break;
  case 4:
    NumToString<int>(&local_90,0xff);
    std::operator+(__return_storage_ptr__,"\"type\" : \"integer\", \"minimum\" : 0, \"maximum\" :",
                   &local_90);
    goto LAB_0020f6af;
  case 5:
    NumToString<short>(&local_30,-0x8000);
    std::operator+(&local_50,"\"type\" : \"integer\", \"minimum\" : ",&local_30);
    std::operator+(&local_90,&local_50,", \"maximum\" : ");
    NumToString<short>(&local_70,0x7fff);
    std::operator+(__return_storage_ptr__,&local_90,&local_70);
    break;
  case 6:
    NumToString<unsigned_short>(&local_90,0xffff);
    std::operator+(__return_storage_ptr__,"\"type\" : \"integer\", \"minimum\" : 0, \"maximum\" : ",
                   &local_90);
    goto LAB_0020f6af;
  case 7:
    NumToString<int>(&local_30,-0x80000000);
    std::operator+(&local_50,"\"type\" : \"integer\", \"minimum\" : ",&local_30);
    std::operator+(&local_90,&local_50,", \"maximum\" : ");
    NumToString<int>(&local_70,0x7fffffff);
    std::operator+(__return_storage_ptr__,&local_90,&local_70);
    break;
  case 8:
    NumToString<unsigned_int>(&local_90,0xffffffff);
    std::operator+(__return_storage_ptr__,"\"type\" : \"integer\", \"minimum\" : 0, \"maximum\" : ",
                   &local_90);
    goto LAB_0020f6af;
  case 9:
    NumToString<long>(&local_30,-0x8000000000000000);
    std::operator+(&local_50,"\"type\" : \"integer\", \"minimum\" : ",&local_30);
    std::operator+(&local_90,&local_50,", \"maximum\" : ");
    NumToString<long>(&local_70,0x7fffffffffffffff);
    std::operator+(__return_storage_ptr__,&local_90,&local_70);
    break;
  case 10:
    NumToString<unsigned_long>(&local_90,0xffffffffffffffff);
    std::operator+(__return_storage_ptr__,"\"type\" : \"integer\", \"minimum\" : 0, \"maximum\" : ",
                   &local_90);
LAB_0020f6af:
    this_00 = &local_90;
    goto LAB_0020f6b4;
  case 0xb:
  case 0xc:
    __s = "\"type\" : \"number\"";
    goto LAB_0020f6c2;
  case 0xd:
    __s = "\"type\" : \"string\"";
    goto LAB_0020f6c2;
  default:
    __s = "";
LAB_0020f6c2:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_90);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  this_00 = &local_30;
LAB_0020f6b4:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

static std::string GenType(BaseType type) {
  switch (type) {
    case BASE_TYPE_BOOL: return "\"type\" : \"boolean\"";
    case BASE_TYPE_CHAR:
      return "\"type\" : \"integer\", \"minimum\" : " +
             NumToString(std::numeric_limits<int8_t>::min()) +
             ", \"maximum\" : " +
             NumToString(std::numeric_limits<int8_t>::max());
    case BASE_TYPE_UCHAR:
      return "\"type\" : \"integer\", \"minimum\" : 0, \"maximum\" :" +
             NumToString(std::numeric_limits<uint8_t>::max());
    case BASE_TYPE_SHORT:
      return "\"type\" : \"integer\", \"minimum\" : " +
             NumToString(std::numeric_limits<int16_t>::min()) +
             ", \"maximum\" : " +
             NumToString(std::numeric_limits<int16_t>::max());
    case BASE_TYPE_USHORT:
      return "\"type\" : \"integer\", \"minimum\" : 0, \"maximum\" : " +
             NumToString(std::numeric_limits<uint16_t>::max());
    case BASE_TYPE_INT:
      return "\"type\" : \"integer\", \"minimum\" : " +
             NumToString(std::numeric_limits<int32_t>::min()) +
             ", \"maximum\" : " +
             NumToString(std::numeric_limits<int32_t>::max());
    case BASE_TYPE_UINT:
      return "\"type\" : \"integer\", \"minimum\" : 0, \"maximum\" : " +
             NumToString(std::numeric_limits<uint32_t>::max());
    case BASE_TYPE_LONG:
      return "\"type\" : \"integer\", \"minimum\" : " +
             NumToString(std::numeric_limits<int64_t>::min()) +
             ", \"maximum\" : " +
             NumToString(std::numeric_limits<int64_t>::max());
    case BASE_TYPE_ULONG:
      return "\"type\" : \"integer\", \"minimum\" : 0, \"maximum\" : " +
             NumToString(std::numeric_limits<uint64_t>::max());
    case BASE_TYPE_FLOAT:
    case BASE_TYPE_DOUBLE: return "\"type\" : \"number\"";
    case BASE_TYPE_STRING: return "\"type\" : \"string\"";
    default: return "";
  }
}